

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void __thiscall helics::MessageHolder::freeMessage(MessageHolder *this,int index)

{
  default_delete<helics::Message> *this_00;
  pointer puVar1;
  tuple<helics::Message_*,_std::default_delete<helics::Message>_> tVar2;
  Message *__ptr;
  iterator __position;
  int local_c;
  
  if ((-1 < index) &&
     (index < (int)((ulong)((long)(this->messages).
                                  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->messages).
                                 super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
    puVar1 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar2.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_> *)
          &puVar1[(uint)index]._M_t.
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>;
    if (tVar2.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl !=
        (_Head_base<0UL,_helics::Message_*,_false>)0x0) {
      this_00 = (default_delete<helics::Message> *)(puVar1 + (uint)index);
      *(undefined8 *)
       ((long)tVar2.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xf8) = 0;
      __ptr = *(Message **)this_00;
      __ptr->messageValidation = 0;
      *(undefined8 *)this_00 = 0;
      local_c = index;
      if (__ptr != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()(this_00,__ptr);
      }
      __position._M_current =
           (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->freeMessageSlots,__position,&local_c);
      }
      else {
        *__position._M_current = local_c;
        (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

void MessageHolder::freeMessage(int index)
{
    if (isValidIndex(index, messages)) {
        if (messages[index]) {
            messages[index]->backReference = nullptr;
            messages[index]->messageValidation = 0;
            messages[index].reset();
            freeMessageSlots.push_back(index);
        }
    }
}